

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
Semantic::Err::UndeclaredLocalVariable::~UndeclaredLocalVariable(UndeclaredLocalVariable *this)

{
  UndeclaredLocalVariable *this_local;
  
  this->super_Error = (Error)&PTR__UndeclaredLocalVariable_001a3338;
  std::__cxx11::string::~string((string *)&this->varName);
  Error::~Error(&this->super_Error);
  return;
}

Assistant:

UndeclaredLocalVariable(std::string varName) : Error() {
                this->varName = varName;
            }